

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O2

void __thiscall
PlayerTableIRCCommand::trigger
          (PlayerTableIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view param_4)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  char *pcVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  Server *pSVar9;
  long lVar10;
  size_t sVar11;
  _Fwd_list_impl _Var12;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> *this_00;
  Server *pSVar13;
  size_t sVar14;
  size_t sVar15;
  uint uVar16;
  undefined1 auVar17 [16];
  string_view color;
  string_view color_00;
  string_view color_01;
  ulong local_108;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> oPlayers;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> nPlayers;
  forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_> gPlayers;
  string_view channel_local;
  double local_b8;
  double dStack_b0;
  PlayerInfo *player;
  anon_class_64_8_03ae175d output_player;
  
  channel_local._M_str = channel._M_str;
  channel_local._M_len = channel._M_len;
  Jupiter::IRC::Client::getChannel
            (source,channel_local._M_len,channel_local._M_str,channel_local._M_str,nick._M_len,
             nick._M_str);
  iVar6 = Jupiter::IRC::Client::Channel::getType();
  color = (string_view)RenX::getTeamColor(GDI);
  color_00 = (string_view)RenX::getTeamColor(Nod);
  color_01 = (string_view)RenX::getTeamColor(Other);
  RenX::getTeamName(GDI);
  RenX::getTeamName(Nod);
  RenX::getTeamName(Other);
  bVar2 = true;
  uVar16 = 0;
  while( true ) {
    RenX::getCore();
    uVar8 = RenX::Core::getServerCount();
    if (uVar8 == uVar16) break;
    uVar8 = RenX::getCore();
    pSVar9 = (Server *)RenX::Core::getServer(uVar8);
    cVar5 = RenX::Server::isLogChanType((int)pSVar9);
    if (cVar5 != '\0') {
      lVar1 = *(long *)(pSVar9 + 0x20);
      lVar10 = RenX::Server::getBotCount();
      if (lVar1 == lVar10) {
        Jupiter::IRC::Client::sendMessage
                  (source,channel_local._M_len,channel_local._M_str,0x17,"No players are in-game.");
        bVar2 = false;
      }
      else {
        gPlayers.super__Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>.
        _M_impl._M_head._M_next =
             (_Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>)
             (_Fwd_list_impl)0x0;
        nPlayers.super__Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>.
        _M_impl._M_head._M_next =
             (_Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>)
             (_Fwd_list_impl)0x0;
        oPlayers.super__Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>.
        _M_impl._M_head._M_next =
             (_Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>)
             (_Fwd_list_impl)0x0;
        uVar7 = 999;
        local_108 = 8;
        local_b8 = 99999.0;
        dStack_b0 = 9999999.0;
        pSVar13 = pSVar9 + 0x10;
        while (pSVar13 = *(Server **)pSVar13, pSVar13 != pSVar9 + 0x10) {
          player = (PlayerInfo *)(pSVar13 + 0x10);
          if (pSVar13[0x110] == (Server)0x0) {
            if (local_108 < *(ulong *)(pSVar13 + 0x20)) {
              local_108 = *(ulong *)(pSVar13 + 0x20);
            }
            if ((int)uVar7 < (int)*(uint *)(pSVar13 + 0x10c)) {
              uVar7 = *(uint *)(pSVar13 + 0x10c);
            }
            this_00 = &nPlayers;
            if (*(int *)(pSVar13 + 0x108) != 1) {
              if (*(int *)(pSVar13 + 0x108) == 0) {
                this_00 = &gPlayers;
              }
              else {
                this_00 = &oPlayers;
              }
            }
            auVar17._8_8_ = dStack_b0;
            auVar17._0_8_ = local_b8;
            auVar17 = maxpd(*(undefined1 (*) [16])(pSVar13 + 0x118),auVar17);
            std::forward_list<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::push_front
                      (this_00,&player);
            local_b8 = auVar17._0_8_;
            dStack_b0 = auVar17._8_8_;
          }
        }
        sVar14 = 1;
        for (; 9 < (int)uVar7; uVar7 = uVar7 / 10) {
          sVar14 = sVar14 + 1;
        }
        sVar15 = 0;
        do {
          local_b8 = local_b8 / 10.0;
          sVar15 = sVar15 + 1;
        } while (1.0 <= local_b8);
        sVar11 = 0;
        do {
          dStack_b0 = dStack_b0 / 10.0;
          sVar11 = sVar11 + 1;
        } while (1.0 <= dStack_b0);
        cVar5 = RenX::Server::isAdminLogChanType((int)pSVar9);
        pcVar4 = channel_local._M_str;
        sVar3 = channel_local._M_len;
        if (cVar5 == '\0') {
          string_printf_abi_cxx11_
                    ((string *)&output_player,"\x1f\x0303%*s | %*s | %*s | %*s",local_108,"Nickname"
                     ,sVar14,"ID",sVar15,"Score",sVar11,"Credits");
          Jupiter::IRC::Client::sendMessage
                    (source,sVar3,pcVar4,CONCAT44(output_player._12_4_,output_player.type),
                     output_player.server);
        }
        else {
          string_printf_abi_cxx11_
                    ((string *)&output_player,"\x1f\x0303%*s | %*s | %*s | %*s | IP Address",
                     local_108,"Nickname",sVar14,"ID",sVar15,"Score",sVar11,"Credits");
          Jupiter::IRC::Client::sendMessage
                    (source,sVar3,pcVar4,CONCAT44(output_player._12_4_,output_player.type),
                     output_player.server);
        }
        std::__cxx11::string::~string((string *)&output_player);
        output_player.server = pSVar9;
        output_player.type = iVar6;
        output_player.source = source;
        output_player.channel = &channel_local;
        output_player.maxNickLen = local_108;
        output_player.idColLen = sVar14;
        output_player.scoreColLen = sVar15;
        output_player.creditColLen = sVar11;
        _Var12._M_head._M_next = (_Fwd_list_node_base)&gPlayers;
        while (_Var12._M_head._M_next =
                    (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var12._M_head._M_next)->_M_next,
              (_Fwd_list_impl)_Var12._M_head._M_next != (_Fwd_list_impl)0x0) {
          trigger::anon_class_64_8_03ae175d::operator()
                    (&output_player,*(PlayerInfo **)((long)_Var12._M_head._M_next + 8),color);
        }
        _Var12._M_head._M_next = (_Fwd_list_node_base)&nPlayers;
        while (_Var12._M_head._M_next =
                    (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var12._M_head._M_next)->_M_next,
              (_Fwd_list_impl)_Var12._M_head._M_next != (_Fwd_list_impl)0x0) {
          trigger::anon_class_64_8_03ae175d::operator()
                    (&output_player,*(PlayerInfo **)((long)_Var12._M_head._M_next + 8),color_00);
        }
        _Var12._M_head._M_next = (_Fwd_list_node_base)&oPlayers;
        while (_Var12._M_head._M_next =
                    (_Fwd_list_node_base)((_Fwd_list_node_base *)_Var12._M_head._M_next)->_M_next,
              (_Fwd_list_impl)_Var12._M_head._M_next != (_Fwd_list_impl)0x0) {
          trigger::anon_class_64_8_03ae175d::operator()
                    (&output_player,*(PlayerInfo **)((long)_Var12._M_head._M_next + 8),color_01);
        }
        std::_Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::
        ~_Fwd_list_base(&oPlayers.
                         super__Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>
                       );
        std::_Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::
        ~_Fwd_list_base(&nPlayers.
                         super__Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>
                       );
        std::_Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>::
        ~_Fwd_list_base(&gPlayers.
                         super__Fwd_list_base<RenX::PlayerInfo_*,_std::allocator<RenX::PlayerInfo_*>_>
                       );
        bVar2 = false;
      }
    }
    uVar16 = uVar16 + 1;
  }
  if (bVar2) {
    Jupiter::IRC::Client::sendMessage
              (source,channel_local._M_len,channel_local._M_str,0x40,
               "Error: Channel not attached to any connected Renegade X servers.");
  }
  return;
}

Assistant:

void PlayerTableIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view )
{
	int type = source->getChannel(channel)->getType();

	// Team colors
	std::string_view gTeamColor = RenX::getTeamColor(RenX::TeamType::GDI);
	std::string_view nTeamColor = RenX::getTeamColor(RenX::TeamType::Nod);
	std::string_view oTeamColor = RenX::getTeamColor(RenX::TeamType::Other);

	// Team names
	std::string_view gTeam = RenX::getTeamName(RenX::TeamType::GDI);
	std::string_view nTeam = RenX::getTeamName(RenX::TeamType::Nod);
	std::string_view oTeam = RenX::getTeamName(RenX::TeamType::Other);

	bool noServers = true;
	for (unsigned int i = 0; i != RenX::getCore()->getServerCount(); i++)
	{
		RenX::Server *server = RenX::getCore()->getServer(i);
		if (server->isLogChanType(type))
		{
			noServers = false;
			if (server->players.size() != server->getBotCount())
			{
				std::forward_list<RenX::PlayerInfo *> gPlayers;
				std::forward_list<RenX::PlayerInfo *> nPlayers;
				std::forward_list<RenX::PlayerInfo *> oPlayers;

				size_t maxNickLen = 8;
				int highID = 999;
				double highScore = 99999.0;
				double highCredits = 9999999.0;

				RenX::PlayerInfo *player;
				for (auto node = server->players.begin(); node != server->players.end(); ++node)
				{
					player = &*node;
					if (player != nullptr && player->isBot == false)
					{
						if (player->name.size() > maxNickLen)
							maxNickLen = player->name.size();

						if (player->id > highID)
							highID = player->id;

						if (player->score > highScore)
							highScore = player->score;

						if (player->credits > highCredits)
							highCredits = player->credits;

						switch (player->team)
						{
						case RenX::TeamType::GDI:
							gPlayers.push_front(player);
							break;
						case RenX::TeamType::Nod:
							nPlayers.push_front(player);
							break;
						default:
							oPlayers.push_front(player);
							break;
						}
					}
				}

				size_t idColLen = 1, scoreColLen = 1, creditColLen = 1;

				while ((highID /= 10) > 0)
					++idColLen;

				while ((highScore /= 10) >= 1.0)
					++scoreColLen;

				while ((highCredits /= 10) >= 1.0)
					++creditColLen;

				if (server->isAdminLogChanType(type))
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s | IP Address", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));
				else
					source->sendMessage(channel, string_printf(IRCUNDERLINE IRCCOLOR "03%*s | %*s | %*s | %*s", maxNickLen, "Nickname", idColLen, "ID", scoreColLen, "Score", creditColLen, "Credits"));

				auto output_player = [server, type, source, &channel, maxNickLen, idColLen, scoreColLen, creditColLen](RenX::PlayerInfo *player, std::string_view color)
				{
					if (server->isAdminLogChanType(type))
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCNORMAL " %.*s", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits, player->ip.size(), player->ip.data()));
					else
						source->sendMessage(channel, string_printf(IRCCOLOR "%.*s%*.*s" IRCCOLOR " " IRCCOLOR "03|" IRCCOLOR " %*d " IRCCOLOR "03|" IRCCOLOR " %*.0f " IRCCOLOR "03|" IRCCOLOR " %*.0f", color.size(),
							color.data(), maxNickLen, player->name.size(), player->name.data(), idColLen, player->id, scoreColLen, player->score, creditColLen, player->credits));
				};

				for (auto node = gPlayers.begin(); node != gPlayers.end(); ++node)
					output_player(*node, gTeamColor);

				for (auto node = nPlayers.begin(); node != nPlayers.end(); ++node)
					output_player(*node, nTeamColor);

				for (auto node = oPlayers.begin(); node != oPlayers.end(); ++node)
					output_player(*node, oTeamColor);
			}
			else source->sendMessage(channel, "No players are in-game."sv);
		}
	}
	if (noServers)
		source->sendMessage(channel, "Error: Channel not attached to any connected Renegade X servers."sv);
}